

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

tuple<double,_double>
MatchingMethod(int param_1,void *param_2,string *whichThread,Mat *croppedFrame)

{
  int iVar1;
  bool bVar2;
  _InputArray *p_Var3;
  undefined4 in_register_0000003c;
  Mat *in_R8;
  _Tuple_impl<1UL,_double> extraout_XMM0_Qa;
  _Head_base<0UL,_double,_false> _Var4;
  tuple<double,_double> tVar5;
  int local_2d4;
  tuple<int,_int> local_2d0;
  Scalar_<double> local_2c8;
  Point_<int> local_2a8;
  _InputOutputArray local_2a0;
  Scalar_<double> local_288;
  Point_<int> local_268;
  Point_<int> local_260;
  _InputOutputArray local_258;
  Scalar_<double> local_240;
  Point_<int> local_220;
  Point_<int> local_218;
  _InputOutputArray local_210;
  Mat local_1f8 [96];
  _InputArray local_198;
  _InputArray local_180;
  Point_<int> local_168;
  Point matchLoc;
  Point maxLoc;
  Point minLoc;
  double maxVal;
  double minVal;
  _InputArray local_e0;
  _InputOutputArray local_c8;
  _InputArray local_b0;
  _OutputArray local_98;
  _InputArray local_70;
  _InputArray local_58;
  int local_40;
  int local_3c;
  int result_rows;
  int result_cols;
  Mat *result_X;
  Mat *croppedFrame_local;
  string *whichThread_local;
  void *param_1_local;
  tuple<double,_double> *ptStack_10;
  int param_0_local;
  
  param_1_local._4_4_ = SUB84(param_2,0);
  croppedFrame_local = croppedFrame;
  whichThread_local = whichThread;
  ptStack_10 = (tuple<double,_double> *)CONCAT44(in_register_0000003c,param_1);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          croppedFrame,"threadA");
  if (bVar2) {
    _result_rows = result_A;
  }
  else {
    _result_rows = result_B;
  }
  local_3c = (*(int *)(in_R8 + 0xc) - templ._12_4_) + 1;
  local_40 = (*(int *)(in_R8 + 8) - templ._8_4_) + 1;
  cv::Mat::create((int)_result_rows,local_40,local_3c);
  cv::_InputArray::_InputArray(&local_58,in_R8);
  cv::_InputArray::_InputArray(&local_70,(Mat *)templ);
  cv::_OutputArray::_OutputArray(&local_98,(Mat *)_result_rows);
  iVar1 = match_method;
  p_Var3 = (_InputArray *)cv::noArray();
  cv::matchTemplate(&local_58,&local_70,&local_98,iVar1,p_Var3);
  cv::_OutputArray::~_OutputArray(&local_98);
  cv::_InputArray::~_InputArray(&local_70);
  cv::_InputArray::~_InputArray(&local_58);
  cv::_InputArray::_InputArray(&local_b0,(Mat *)_result_rows);
  cv::_InputOutputArray::_InputOutputArray(&local_c8,(Mat *)_result_rows);
  cv::Mat::Mat((Mat *)&minVal);
  cv::_InputArray::_InputArray(&local_e0,(Mat *)&minVal);
  cv::normalize(&local_b0,&local_c8,0.0,1.0,0x20,-1,&local_e0);
  cv::_InputArray::~_InputArray(&local_e0);
  cv::Mat::~Mat((Mat *)&minVal);
  cv::_InputOutputArray::~_InputOutputArray(&local_c8);
  cv::_InputArray::~_InputArray(&local_b0);
  cv::Point_<int>::Point_(&maxLoc);
  cv::Point_<int>::Point_(&matchLoc);
  cv::Point_<int>::Point_(&local_168);
  cv::_InputArray::_InputArray(&local_180,(Mat *)_result_rows);
  cv::Mat::Mat(local_1f8);
  cv::_InputArray::_InputArray(&local_198,local_1f8);
  cv::minMaxLoc(&local_180,&maxVal,(double *)&minLoc,(Point_ *)&maxLoc,(Point_ *)&matchLoc,
                &local_198);
  cv::_InputArray::~_InputArray(&local_198);
  cv::Mat::~Mat(local_1f8);
  cv::_InputArray::~_InputArray(&local_180);
  if ((match_method == 0) || (match_method == 1)) {
    cv::Point_<int>::operator=(&local_168,&maxLoc);
  }
  else {
    cv::Point_<int>::operator=(&local_168,&matchLoc);
  }
  cv::_InputOutputArray::_InputOutputArray(&local_210,in_R8);
  cv::Point_<int>::Point_(&local_218,&local_168);
  cv::Point_<int>::Point_(&local_220,local_168.x + templ._12_4_,local_168.y + templ._8_4_);
  cv::Scalar_<double>::all(&local_240,0.0);
  cv::rectangle(&local_210,&local_218,&local_220,&local_240,2,8,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_210);
  cv::_InputOutputArray::_InputOutputArray(&local_258,(Mat *)_result_rows);
  cv::Point_<int>::Point_(&local_260,&local_168);
  cv::Point_<int>::Point_(&local_268,local_168.x + templ._12_4_,local_168.y + templ._8_4_);
  cv::Scalar_<double>::all(&local_288,0.0);
  cv::rectangle(&local_258,&local_260,&local_268,&local_288,2,8,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_258);
  cv::_InputOutputArray::_InputOutputArray(&local_2a0,in_R8);
  cv::Point_<int>::Point_
            (&local_2a8,local_168.x + (int)templ._12_4_ / 2,local_168.y + (int)templ._8_4_ / 2);
  _Var4._M_head_impl = 255.0;
  cv::Scalar_<double>::Scalar_(&local_2c8,0.0,255.0,0.0,0.0);
  cv::circle(&local_2a0,&local_2a8,0,&local_2c8,5,8,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_2a0);
  local_2d4 = local_168.x + (int)templ._12_4_ / 2;
  std::make_tuple<int,int>((int *)&local_2d0,&local_2d4);
  std::tuple<double,_double>::tuple<int,_int,_true>
            ((tuple<double,_double> *)CONCAT44(in_register_0000003c,param_1),&local_2d0);
  tVar5.super__Tuple_impl<0UL,_double,_double>.super__Head_base<0UL,_double,_false>._M_head_impl =
       _Var4._M_head_impl;
  tVar5.super__Tuple_impl<0UL,_double,_double>.super__Tuple_impl<1UL,_double>.
  super__Head_base<1UL,_double,_false>._M_head_impl =
       extraout_XMM0_Qa.super__Head_base<1UL,_double,_false>._M_head_impl;
  return (tuple<double,_double>)tVar5.super__Tuple_impl<0UL,_double,_double>;
}

Assistant:

tuple<double, double> MatchingMethod( int, void*, const string& whichThread, Mat croppedFrame) {
    Mat *result_X;
    if(whichThread=="threadA"){
        result_X = &result_A;
    }else{
        result_X = &result_B;
    }

    /// Create the result matrix
    int result_cols =  croppedFrame.cols - templ.cols + 1;
    int result_rows = croppedFrame.rows - templ.rows + 1;

    result_X->create(result_rows, result_cols, CV_32FC1);

    /// Do the Matching and Normalize
    matchTemplate( croppedFrame, templ, *result_X, match_method );
    normalize( *result_X, *result_X, 0, 1, NORM_MINMAX, -1, Mat() );

    /// Localizing the best match with minMaxLoc
    double minVal; double maxVal; Point minLoc; Point maxLoc;
    Point matchLoc;

    minMaxLoc( *result_X, &minVal, &maxVal, &minLoc, &maxLoc, Mat() );

    /// For SQDIFF and SQDIFF_NORMED, the best matches are lower values. For all the other methods, the higher the better
    if( match_method  == TM_SQDIFF || match_method == TM_SQDIFF_NORMED ) {
        matchLoc = minLoc;
    } else {
        matchLoc = maxLoc;
    }

    /// Show me what you got
    rectangle( croppedFrame, matchLoc, Point( matchLoc.x + templ.cols , matchLoc.y + templ.rows ), Scalar::all(0), 2, 8, 0 );
    rectangle( *result_X, matchLoc, Point( matchLoc.x + templ.cols , matchLoc.y + templ.rows ), Scalar::all(0), 2, 8, 0 );
    circle(croppedFrame,Point(matchLoc.x + templ.cols/2, matchLoc.y + templ.rows/2),0,Scalar( 0, 255, 0 ),5);

    /// computing and returning the position
    return std::make_tuple(matchLoc.x + templ.cols/2, matchLoc.y + templ.rows/2);
}